

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O1

void __thiscall libtorrent::natpmp::close_impl(natpmp *this)

{
  pointer pmVar1;
  service_type *psVar2;
  mapping_t *m;
  pointer pmVar3;
  double in_XMM0_Qa;
  
  this->m_abort = true;
  log(this,in_XMM0_Qa);
  if (this->m_disabled != false) {
    return;
  }
  pmVar1 = (this->m_mappings).
           super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
           .
           super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pmVar3 = (this->m_mappings).
                super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                .
                super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                ._M_impl.super__Vector_impl_data._M_start; pmVar3 != pmVar1; pmVar3 = pmVar3 + 1) {
    if ((pmVar3->super_base_mapping).protocol != none) {
      (pmVar3->super_base_mapping).act = del;
    }
  }
  if ((this->m_refresh_timer).impl_.implementation_.might_have_pending_waits == true) {
    psVar2 = (this->m_refresh_timer).impl_.service_;
    boost::asio::detail::epoll_reactor::
    cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar2->scheduler_,&psVar2->timer_queue_,
               &(this->m_refresh_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
    (this->m_refresh_timer).impl_.implementation_.might_have_pending_waits = false;
  }
  (this->m_currently_mapping).m_val = -1;
  update_mapping(this,(port_mapping_t)0x0);
  return;
}

Assistant:

void natpmp::close_impl()
{
	TORRENT_ASSERT(is_single_thread());
	m_abort = true;
#ifndef TORRENT_DISABLE_LOGGING
	log("closing");
#endif
	if (m_disabled) return;
	for (auto& m : m_mappings)
	{
		if (m.protocol == portmap_protocol::none) continue;
		m.act = portmap_action::del;
	}
	m_refresh_timer.cancel();
	m_currently_mapping = port_mapping_t{-1};
	update_mapping(port_mapping_t{});
}